

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnsetCommand.cxx
# Opt level: O1

bool __thiscall
cmUnsetCommand::InitialPass
          (cmUnsetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  string *psVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  string local_40;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((name == psVar1) || (uVar5 = (long)psVar1 - (long)name >> 5, 2 < uVar5)) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_40);
LAB_00294939:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  else {
    iVar4 = strncmp((name->_M_dataplus)._M_p,"ENV{",4);
    if ((iVar4 == 0) && (5 < name->_M_string_length)) {
      std::__cxx11::string::substr((ulong)&local_40,(ulong)name);
      cmSystemTools::UnsetEnv(local_40._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    else if (uVar5 == 2) {
      iVar4 = std::__cxx11::string::compare((char *)(name + 1));
      if (iVar4 != 0) goto LAB_002949f3;
      cmMakefile::RemoveCacheDefinition((this->super_cmCommand).Makefile,name);
    }
    else {
      if (uVar5 != 1) {
LAB_002949f3:
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 == 0x40) {
          iVar4 = std::__cxx11::string::compare((char *)(pbVar2 + 1));
          if (iVar4 == 0) {
            cmMakefile::RaiseScope((this->super_cmCommand).Makefile,name,(char *)0x0);
            goto LAB_00294a66;
          }
        }
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"called with an invalid second argument","");
        cmCommand::SetError(&this->super_cmCommand,&local_40);
        goto LAB_00294939;
      }
      cmMakefile::RemoveDefinition((this->super_cmCommand).Makefile,name);
    }
LAB_00294a66:
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool cmUnsetCommand::InitialPass(std::vector<std::string> const& args,
                                 cmExecutionStatus&)
{
  if (args.empty() || args.size() > 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  auto const& variable = args[0];

  // unset(ENV{VAR})
  if (cmHasLiteralPrefix(variable, "ENV{") && variable.size() > 5) {
    // what is the variable name
    auto const& envVarName = variable.substr(4, variable.size() - 5);

#ifdef CMAKE_BUILD_WITH_CMAKE
    cmSystemTools::UnsetEnv(envVarName.c_str());
#endif
    return true;
  }
  // unset(VAR)
  if (args.size() == 1) {
    this->Makefile->RemoveDefinition(variable);
    return true;
  }
  // unset(VAR CACHE)
  if ((args.size() == 2) && (args[1] == "CACHE")) {
    this->Makefile->RemoveCacheDefinition(variable);
    return true;
  }
  // unset(VAR PARENT_SCOPE)
  if ((args.size() == 2) && (args[1] == "PARENT_SCOPE")) {
    this->Makefile->RaiseScope(variable, nullptr);
    return true;
  }
  // ERROR: second argument isn't CACHE or PARENT_SCOPE
  this->SetError("called with an invalid second argument");
  return false;
}